

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_algebra.h
# Opt level: O2

mat4 * dja::operator*(mat4 *__return_storage_ptr__,float_t s,mat4 *m)

{
  vec4 vVar1;
  vec4 vVar2;
  vec4 vVar3;
  vec4 vVar4;
  float_t local_68;
  float_t fStack_64;
  float_t local_48;
  float_t fStack_44;
  float_t local_28;
  float_t fStack_24;
  
  vVar1 = operator*(s,m->m);
  vVar2 = operator*(s,m->m + 1);
  vVar3 = operator*(s,m->m + 2);
  vVar4 = operator*(s,m->m + 3);
  local_28 = vVar1.x;
  fStack_24 = vVar1.y;
  __return_storage_ptr__->m[0].x = local_28;
  __return_storage_ptr__->m[0].y = fStack_24;
  __return_storage_ptr__->m[0].z = vVar1.z;
  __return_storage_ptr__->m[0].w = vVar1.w;
  local_48 = vVar2.x;
  fStack_44 = vVar2.y;
  __return_storage_ptr__->m[1].x = local_48;
  __return_storage_ptr__->m[1].y = fStack_44;
  __return_storage_ptr__->m[1].z = vVar2.z;
  __return_storage_ptr__->m[1].w = vVar2.w;
  local_68 = vVar3.x;
  fStack_64 = vVar3.y;
  __return_storage_ptr__->m[2].x = local_68;
  __return_storage_ptr__->m[2].y = fStack_64;
  __return_storage_ptr__->m[2].z = vVar3.z;
  __return_storage_ptr__->m[2].w = vVar3.w;
  __return_storage_ptr__->m[3] = vVar4;
  return __return_storage_ptr__;
}

Assistant:

mat4 operator*(const float_t s, const mat4& m)
{
    return mat4(s * m[0], s * m[1], s * m[2], s * m[3]);
}